

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

int Kf_SetMergeSimpleOne(Kf_Cut_t *pCut0,Kf_Cut_t *pCut1,Kf_Cut_t *pCut,int nLutSize)

{
  int iVar1;
  int iVar2;
  int local_5c;
  int local_58;
  int c;
  int k;
  int i;
  int *pC;
  int *pC1;
  int *pC0;
  int nSize1;
  int nSize0;
  int nLutSize_local;
  Kf_Cut_t *pCut_local;
  Kf_Cut_t *pCut1_local;
  Kf_Cut_t *pCut0_local;
  
  iVar1 = pCut0->nLeaves;
  iVar2 = pCut1->nLeaves;
  c = 0;
  local_5c = iVar1;
  do {
    if (iVar2 <= c) {
      for (c = 0; c < iVar1; c = c + 1) {
        pCut->pLeaves[c] = pCut0->pLeaves[c];
      }
      pCut->nLeaves = local_5c;
      return 1;
    }
    for (local_58 = 0; (local_58 < iVar1 && (pCut1->pLeaves[c] != pCut0->pLeaves[local_58]));
        local_58 = local_58 + 1) {
    }
    if (iVar1 <= local_58) {
      if (local_5c == nLutSize) {
        return 0;
      }
      pCut->pLeaves[local_5c] = pCut1->pLeaves[c];
      local_5c = local_5c + 1;
    }
    c = c + 1;
  } while( true );
}

Assistant:

static inline int Kf_SetMergeSimpleOne( Kf_Cut_t * pCut0, Kf_Cut_t * pCut1, Kf_Cut_t * pCut, int nLutSize )
{ 
    int nSize0 = pCut0->nLeaves;
    int nSize1 = pCut1->nLeaves;
    int * pC0 = pCut0->pLeaves;
    int * pC1 = pCut1->pLeaves;
    int * pC = pCut->pLeaves;
    int i, k, c;
    // compare two cuts with different numbers
    c = nSize0;
    for ( i = 0; i < nSize1; i++ )
    {
        for ( k = 0; k < nSize0; k++ )
            if ( pC1[i] == pC0[k] )
                break;
        if ( k < nSize0 )
            continue;
        if ( c == nLutSize )
            return 0;
        pC[c++] = pC1[i];
    }
    for ( i = 0; i < nSize0; i++ )
        pC[i] = pC0[i];
    pCut->nLeaves = c;
    return 1;
}